

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

char ** Abc_NtkCollectCioNames(Abc_Ntk_t *pNtk,int fCollectCos)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (fCollectCos == 0) {
    pVVar4 = pNtk->vCis;
    iVar1 = pVVar4->nSize;
    ppcVar2 = (char **)malloc((long)iVar1 * 8);
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        pcVar3 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar4->pArray[lVar5] + 0x18),
                            (int)*(long *)((long)pVVar4->pArray[lVar5] + 0x10));
        ppcVar2[lVar5] = pcVar3;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vCis;
      } while (lVar5 < pVVar4->nSize);
    }
  }
  else {
    pVVar4 = pNtk->vCos;
    iVar1 = pVVar4->nSize;
    ppcVar2 = (char **)malloc((long)iVar1 * 8);
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        pcVar3 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar4->pArray[lVar5] + 0x18),
                            (int)*(long *)((long)pVVar4->pArray[lVar5] + 0x10));
        ppcVar2[lVar5] = pcVar3;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vCos;
      } while (lVar5 < pVVar4->nSize);
    }
  }
  return ppcVar2;
}

Assistant:

char ** Abc_NtkCollectCioNames( Abc_Ntk_t * pNtk, int fCollectCos )
{
    Abc_Obj_t * pObj;
    char ** ppNames;
    int i;
    if ( fCollectCos )
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    else
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    return ppNames;
}